

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

ValueType __thiscall wabt::interp::FuncDesc::GetLocalType(FuncDesc *this,Index index)

{
  pointer pTVar1;
  pointer pLVar2;
  pointer pLVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pTVar1 = (this->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3;
  if (index < uVar4) {
    pLVar3 = (pointer)(pTVar1 + index);
  }
  else {
    pLVar3 = (this->locals).
             super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (this->locals).
             super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (long)pLVar2 - (long)pLVar3 >> 4;
    while (uVar5 = uVar6, 0 < (long)uVar5) {
      uVar6 = uVar5 >> 1;
      if (pLVar3[uVar6].end < (index - (int)uVar4) + 1) {
        pLVar3 = pLVar3 + uVar6 + 1;
        uVar6 = ~uVar6 + uVar5;
      }
    }
    if (pLVar3 == pLVar2) {
      __assert_fail("iter != locals.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                    ,0xd5,"ValueType wabt::interp::FuncDesc::GetLocalType(Index) const");
    }
  }
  return pLVar3->type;
}

Assistant:

ValueType FuncDesc::GetLocalType(Index index) const {
  if (index < type.params.size()) {
    return type.params[index];
  }
  index -= type.params.size();

  auto iter = std::lower_bound(
      locals.begin(), locals.end(), index + 1,
      [](const LocalDesc& lhs, Index rhs) { return lhs.end < rhs; });
  assert(iter != locals.end());
  return iter->type;
}